

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O0

void __thiscall libtorrent::dht::traversal_algorithm::add_router_entries(traversal_algorithm *this)

{
  bool bVar1;
  uint uVar2;
  node *this_00;
  dht_observer *pdVar3;
  router_iterator __first;
  router_iterator __last;
  ulong uVar4;
  routing_table *this_01;
  digest32<160L> local_5c;
  endpoint *local_48;
  basic_endpoint<boost::asio::ip::udp> *n;
  router_iterator __end2;
  router_iterator __begin2;
  routing_table *__range2;
  dht_observer *logger;
  traversal_algorithm *this_local;
  
  this_00 = get_node(this);
  pdVar3 = dht::node::observer(this_00);
  if ((pdVar3 != (dht_observer *)0x0) &&
     (uVar2 = (**(pdVar3->super_dht_logger)._vptr_dht_logger)(pdVar3,4), (uVar2 & 1) != 0)) {
    uVar2 = this->m_id;
    __first = routing_table::begin(&this->m_node->m_table);
    __last = routing_table::end(&this->m_node->m_table);
    uVar4 = ::std::
            distance<std::_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                      ((_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
                        )__first._M_node,
                       (_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>
                        )__last._M_node);
    (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
              (pdVar3,4,"[%u] using router nodes to initiate traversal algorithm %d routers",
               (ulong)uVar2,uVar4 & 0xffffffff);
  }
  this_01 = &this->m_node->m_table;
  __end2 = routing_table::begin(this_01);
  n = (basic_endpoint<boost::asio::ip::udp> *)routing_table::end(this_01);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&n), bVar1) {
    local_48 = ::std::
               _Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>::
               operator*(&__end2);
    digest32<160L>::digest32(&local_5c);
    add_entry(this,&local_5c,local_48,(observer_flags_t)0x2);
    ::std::_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void traversal_algorithm::add_router_entries()
{
	INVARIANT_CHECK;
#ifndef TORRENT_DISABLE_LOGGING
	dht_observer* logger = get_node().observer();
	if (logger != nullptr && logger->should_log(dht_logger::traversal))
	{
		logger->log(dht_logger::traversal
			, "[%u] using router nodes to initiate traversal algorithm %d routers"
			, m_id, int(std::distance(m_node.m_table.begin(), m_node.m_table.end())));
	}
#endif
	for (auto const& n : m_node.m_table)
		add_entry(node_id(), n, observer::flag_initial);
}